

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::GetAutoUicOptions
          (cmTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  char *pcVar1;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  allocator local_131;
  cmGeneratorExpression local_130;
  cmGeneratorExpression local_128;
  string local_120;
  string local_100;
  cmGeneratorExpressionDAGChecker local_e0;
  
  std::__cxx11::string::string((string *)&local_e0,"AUTOUIC_OPTIONS",(allocator *)&local_120);
  pcVar1 = GetLinkInterfaceDependentStringProperty(this,(string *)&local_e0,config);
  std::__cxx11::string::~string((string *)&local_e0);
  if (pcVar1 != (char *)0x0) {
    cmGeneratorExpression::cmGeneratorExpression(&local_128,(cmListFileBacktrace *)0x0);
    std::__cxx11::string::string((string *)&local_120,"AUTOUIC_OPTIONS",(allocator *)&local_100);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&local_e0,&this->Name,&local_120,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_120);
    cmGeneratorExpression::Parse(&local_130,(char *)&local_128);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    local_100._M_string_length = 0;
    local_100.field_2._M_local_buf[0] = '\0';
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)local_130.Backtrace,this->Makefile,config,
                        false,this,&local_e0,&local_100);
    std::__cxx11::string::string((string *)&local_120,pcVar1,&local_131);
    cmSystemTools::ExpandListArgument(&local_120,result,false);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_130);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker(&local_e0);
    cmGeneratorExpression::~cmGeneratorExpression(&local_128);
  }
  return;
}

Assistant:

void cmTarget::GetAutoUicOptions(std::vector<std::string> &result,
                                 const std::string& config) const
{
  const char *prop
            = this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS",
                                                            config);
  if (!prop)
    {
    return;
    }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
                                      this->GetName(),
                                      "AUTOUIC_OPTIONS", 0, 0);
  cmSystemTools::ExpandListArgument(ge.Parse(prop)
                                      ->Evaluate(this->Makefile,
                                                config,
                                                false,
                                                this,
                                                &dagChecker),
                                  result);
}